

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

DdNode * Extra_bddTuples(DdManager *dd,int K,DdNode *VarsN)

{
  int iVar1;
  int iVar2;
  int iVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  
  iVar1 = dd->autoDyn;
  dd->autoDyn = 0;
  while( true ) {
    pDVar4 = dd->one;
    iVar2 = 0;
    if (pDVar4 != VarsN) {
      iVar2 = 0;
      pDVar5 = VarsN;
      do {
        if ((pDVar5->type).kids.E != (DdNode *)((ulong)pDVar4 ^ 1)) {
          return (DdNode *)0x0;
        }
        iVar2 = iVar2 + 1;
        pDVar5 = (pDVar5->type).kids.T;
      } while (pDVar5 != pDVar4);
    }
    iVar3 = iVar2 - K;
    if (iVar2 < K) break;
    pDVar4 = VarsN;
    if (iVar3 != 0 && K <= iVar2) {
      do {
        pDVar4 = (pDVar4->type).kids.T;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    dd->reordered = 0;
    pDVar4 = extraBddTuples(dd,pDVar4,VarsN);
    if (dd->reordered != 1) {
      dd->autoDyn = iVar1;
      return pDVar4;
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode * Extra_bddTuples( 
  DdManager * dd,   /* the DD manager */
  int K,            /* the number of variables in tuples */
  DdNode * VarsN)   /* the set of all variables represented as a BDD */
{
    DdNode  *res;
    int     autoDyn;

    /* it is important that reordering does not happen, 
       otherwise, this methods will not work */

    autoDyn = dd->autoDyn;
    dd->autoDyn = 0;

    do {
        /* transform the numeric arguments (K) into a DdNode * argument;
         * this allows us to use the standard internal CUDD cache */
        DdNode *VarSet = VarsN, *VarsK = VarsN;
        int     nVars = 0, i;

        /* determine the number of variables in VarSet */
        while ( VarSet != b1 )
        {
            nVars++;
            /* make sure that the VarSet is a cube */
            if ( cuddE( VarSet ) != b0 )
                return NULL;
            VarSet = cuddT( VarSet );
        }
        /* make sure that the number of variables in VarSet is less or equal 
           that the number of variables that should be present in the tuples
        */
        if ( K > nVars )
            return NULL;

        /* the second argument in the recursive call stands for <n>;
         * create the first argument, which stands for <k> 
         * as when we are talking about the tuple of <k> out of <n> */
        for ( i = 0; i < nVars-K; i++ )
            VarsK = cuddT( VarsK );

        dd->reordered = 0;
        res = extraBddTuples(dd, VarsK, VarsN );

    } while (dd->reordered == 1);
    dd->autoDyn = autoDyn;
    return(res);

}